

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm3.c
# Opt level: O0

int SM3_final_noclear(SM3_CTX *ctx,uint8_t *digest)

{
  uint32_t uVar1;
  long in_RSI;
  uint32_t *in_RDI;
  uint32_t *count;
  uint8_t block [64];
  uint32_t tdigest [8];
  uint32_t *pdigest;
  int num;
  int i;
  size_t in_stack_ffffffffffffff68;
  uint32_t *pnt;
  uint8_t local_88 [56];
  uint32_t local_50 [2];
  uint32_t local_48 [8];
  long local_28;
  uint32_t local_20;
  uint local_1c;
  uint32_t *local_10;
  int local_4;
  
  if (((sm3_compress_impl == (_func_void_uint32_t_ptr_uint8_t_ptr_int *)0x0) ||
      (in_RDI == (uint32_t *)0x0)) || (in_RSI == 0)) {
    local_4 = 0;
  }
  else {
    pnt = local_50;
    local_48[0] = *in_RDI;
    local_48[1] = in_RDI[1];
    local_48[2] = in_RDI[2];
    local_48[3] = in_RDI[3];
    local_48[4] = in_RDI[4];
    local_48[5] = in_RDI[5];
    local_48[6] = in_RDI[6];
    local_48[7] = in_RDI[7];
    local_20 = in_RDI[0x19];
    local_28 = in_RSI;
    local_10 = in_RDI;
    memcpy(local_88,in_RDI + 9,(long)(int)local_20);
    local_88[(int)local_20] = 0x80;
    if ((int)(local_20 + 9) < 0x41) {
      memset(local_88 + (long)(int)local_20 + 1,0,(long)(int)(0x37 - local_20));
    }
    else {
      memset(local_88 + (long)(int)local_20 + 1,0,(long)(int)(0x3f - local_20));
      (*sm3_compress_impl)(local_48,local_88,1);
      memset(local_88,0,0x38);
    }
    uVar1 = to_be32(local_10[8] >> 0x17);
    *pnt = uVar1;
    uVar1 = to_be32(local_10[8] * 0x200 + local_20 * 8);
    pnt[1] = uVar1;
    (*sm3_compress_impl)(local_48,local_88,1);
    for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
      uVar1 = to_be32(local_48[(int)local_1c]);
      *(uint32_t *)(local_28 + (long)(int)local_1c * 4) = uVar1;
    }
    CRYPTO_memzero(pnt,in_stack_ffffffffffffff68);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int SM3_final_noclear(SM3_CTX *ctx, uint8_t *digest)
{
    if (sm3_compress_impl == NULL || ctx == NULL || digest == NULL)
        return GML_ERROR;

    int i;
    int num;
    uint32_t *pdigest = (uint32_t*)digest;
    uint32_t tdigest[8];
    uint8_t block[SM3_BLOCK_SIZE];
    uint32_t *count = (uint32_t*)(block + SM3_BLOCK_SIZE - 8);

    tdigest[0] = ctx->digest[0];
    tdigest[1] = ctx->digest[1];
    tdigest[2] = ctx->digest[2];
    tdigest[3] = ctx->digest[3];
    tdigest[4] = ctx->digest[4];
    tdigest[5] = ctx->digest[5];
    tdigest[6] = ctx->digest[6];
    tdigest[7] = ctx->digest[7];
    num = ctx->num;
    memcpy(block, ctx->block, num);
    block[num] = 0x80U;

    if (num + 9 <= SM3_BLOCK_SIZE) 
        memset(block + num + 1, 0, SM3_BLOCK_SIZE - num - 9);
    else {
        memset(block + num + 1, 0, SM3_BLOCK_SIZE - num - 1);
        sm3_compress_impl(tdigest, block, 1);
        memset(block, 0, SM3_BLOCK_SIZE - 8);
    }

    count[0] = to_be32((ctx->nblocks) >> 23);
    count[1] = to_be32((ctx->nblocks << 9) + (num << 3));

    sm3_compress_impl(tdigest, block, 1);
    for (i = 0; i < sizeof(tdigest)/sizeof(tdigest[0]); i++) 
        pdigest[i] = to_be32(tdigest[i]);

    CRYPTO_memzero(tdigest, SM3_DIGEST_LENGTH);
    return GML_OK;
}